

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetupDrawChannels(ImGuiTable *table)

{
  ImGuiTableDrawChannelIdx IVar1;
  ImGuiTableDrawChannelIdx IVar2;
  long lVar3;
  ImGuiTableColumn *pIVar4;
  int channels_count;
  char cVar5;
  ImGuiTableDrawChannelIdx IVar6;
  int iVar7;
  bool bVar8;
  
  iVar7 = 1;
  if ((table->Flags & 0x100000) == 0) {
    iVar7 = (int)table->ColumnsEnabledCount;
  }
  bVar8 = true;
  if (table->ColumnsCount <= (int)table->ColumnsEnabledCount) {
    bVar8 = table->VisibleMaskByIndex != table->EnabledMaskByIndex;
  }
  channels_count =
       ('\0' < table->FreezeRowsCount | 2) + (uint)bVar8 +
       (iVar7 << ('\0' < table->FreezeRowsCount));
  ImDrawListSplitter::Split(&table->DrawSplitter,table->InnerWindow->DrawList,channels_count);
  IVar1 = 0xff;
  if (bVar8 != false) {
    IVar1 = (char)channels_count + 0xff;
  }
  table->DummyDrawChannel = IVar1;
  table->Bg1DrawChannelCurrent = '\x01';
  IVar2 = (char)iVar7 + '\x02';
  if (table->FreezeRowsCount < '\x01') {
    IVar2 = '\x01';
  }
  table->Bg1DrawChannelUnfrozen = IVar2;
  lVar3 = (long)table->ColumnsCount;
  if (0 < lVar3) {
    pIVar4 = (table->Columns).Data;
    cVar5 = '\0';
    if ('\0' < table->FreezeRowsCount) {
      cVar5 = (char)iVar7 + '\x01';
    }
    IVar2 = '\x02';
    do {
      if ((table->Columns).DataEnd <= pIVar4) {
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_internal.h"
                      ,0x20b,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
      }
      if ((pIVar4->IsVisibleX == true) && (pIVar4->IsVisibleY == true)) {
        pIVar4->DrawChannelFrozen = IVar2;
        pIVar4->DrawChannelUnfrozen = IVar2 + cVar5;
        IVar6 = IVar2;
        IVar2 = IVar2 + ((table->Flags & 0x100000) == 0);
      }
      else {
        pIVar4->DrawChannelUnfrozen = IVar1;
        pIVar4->DrawChannelFrozen = IVar1;
        IVar6 = IVar1;
      }
      pIVar4->DrawChannelCurrent = IVar6;
      pIVar4 = pIVar4 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void ImGui::TableSetupDrawChannels(ImGuiTable* table)
{
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClip) ? 1 : table->ColumnsEnabledCount;
    const int channels_for_bg = 1 + 1 * freeze_row_multiplier;
    const int channels_for_dummy = (table->ColumnsEnabledCount < table->ColumnsCount || table->VisibleMaskByIndex != table->EnabledMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_bg + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter.Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = (ImGuiTableDrawChannelIdx)((channels_for_dummy > 0) ? channels_total - 1 : -1);
    table->Bg1DrawChannelCurrent = TABLE_DRAW_CHANNEL_BG1_FROZEN;
    table->Bg1DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)((table->FreezeRowsCount > 0) ? 2 + channels_for_row : TABLE_DRAW_CHANNEL_BG1_FROZEN);

    int draw_channel_current = 2;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->IsVisibleX && column->IsVisibleY)
        {
            column->DrawChannelFrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current);
            column->DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row + 1 : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClip))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelFrozen = column->DrawChannelUnfrozen = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelFrozen;
    }
}